

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v7::detail::next_code_point<char>(char *begin,char *end)

{
  bool bVar1;
  char *end_local;
  char *begin_local;
  
  end_local = begin;
  if (((int)*begin & 0x80U) == 0) {
    begin_local = begin + 1;
  }
  else {
    do {
      end_local = end_local + 1;
      bVar1 = false;
      if (end_local != end) {
        bVar1 = ((int)*end_local & 0xc0U) == 0x80;
      }
      begin_local = end_local;
    } while (bVar1);
  }
  return begin_local;
}

Assistant:

FMT_CONSTEXPR const Char* next_code_point(const Char* begin, const Char* end) {
  if (const_check(sizeof(Char) != 1) || (*begin & 0x80) == 0) return begin + 1;
  do {
    ++begin;
  } while (begin != end && (*begin & 0xc0) == 0x80);
  return begin;
}